

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void ParseTag(TidyDocImpl *doc,Node *node,GetTokenMode mode)

{
  Dict *pDVar1;
  Lexer *pLVar2;
  Parser *UNRECOVERED_JUMPTABLE;
  
  pDVar1 = node->tag;
  if (pDVar1 != (Dict *)0x0) {
    pLVar2 = doc->lexer;
    if ((pDVar1->model & 1) == 0) {
      if ((pDVar1->model & 0x10) == 0) {
        pLVar2->insertspace = no;
      }
    }
    else {
      pLVar2->waswhite = no;
      if (pDVar1->parser == (Parser *)0x0) {
        return;
      }
    }
    UNRECOVERED_JUMPTABLE = pDVar1->parser;
    if ((UNRECOVERED_JUMPTABLE != (Parser *)0x0) && (node->type != StartEndTag)) {
      pLVar2->parent = node;
      (*UNRECOVERED_JUMPTABLE)(doc,node,mode);
      return;
    }
  }
  return;
}

Assistant:

static void ParseTag( TidyDocImpl* doc, Node *node, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;

    if (node->tag == NULL) /* [i_a]2 prevent crash for active content (php, asp) docs */
        return;

    /*
       Fix by GLP 2000-12-21.  Need to reset insertspace if this 
       is both a non-inline and empty tag (base, link, meta, isindex, hr, area).
    */
    if (node->tag->model & CM_EMPTY)
    {
        lexer->waswhite = no;
        if (node->tag->parser == NULL)
            return;
    }
    else if (!(node->tag->model & CM_INLINE))
        lexer->insertspace = no;

    if (node->tag->parser == NULL)
        return;

    if (node->type == StartEndTag)
        return;

    lexer->parent = node; /* [i_a]2 added this - not sure why - CHECKME: */

    (*node->tag->parser)( doc, node, mode );
}